

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O3

TLVWriter * __thiscall ASDCP::MXF::TLVWriter::WriteTag(TLVWriter *this,MDDEntry *Entry)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  ILogSink *pIVar4;
  long in_RDX;
  undefined1 *puVar5;
  TagValue TmpTag;
  undefined1 local_9a;
  undefined1 local_99;
  int local_98 [26];
  
  plVar3 = *(long **)Entry[2].ul;
  if (plVar3 == (long *)0x0) {
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar4,"No Primer object available.\n");
  }
  else {
    (**(code **)(*plVar3 + 0x18))((Result_t *)local_98,plVar3,in_RDX,&local_9a);
    iVar2 = Kumu::RESULT_OK;
    Kumu::Result_t::~Result_t((Result_t *)local_98);
    if (local_98[0] == iVar2) {
      if (*(uint *)(Entry->ul + 8) < *(uint *)(Entry->ul + 0xc) + 1) {
        local_98[0] = 0x262;
LAB_001a22cd:
        Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
        return this;
      }
      *(undefined1 *)(*(long *)Entry->ul + (ulong)*(uint *)(Entry->ul + 0xc)) = local_9a;
      iVar2 = *(int *)(Entry->ul + 0xc);
      uVar1 = iVar2 + 1;
      *(uint *)(Entry->ul + 0xc) = uVar1;
      if (*(uint *)(Entry->ul + 8) < iVar2 + 2U) {
        local_98[0] = 0x263;
        goto LAB_001a22cd;
      }
      *(undefined1 *)(*(long *)Entry->ul + (ulong)uVar1) = local_99;
      *(int *)(Entry->ul + 0xc) = *(int *)(Entry->ul + 0xc) + 1;
      puVar5 = (undefined1 *)&Kumu::RESULT_OK;
      goto LAB_001a229a;
    }
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar4,"No tag for entry %s\n",*(undefined8 *)(in_RDX + 0x18));
  }
  puVar5 = Kumu::RESULT_FAIL;
LAB_001a229a:
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar5);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVWriter::WriteTag(const MDDEntry& Entry)
{
  if ( m_Lookup == 0 )
    {
      DefaultLogSink().Error("No Primer object available.\n");
      return RESULT_FAIL;
    }

  TagValue TmpTag;

  if ( m_Lookup->InsertTag(Entry, TmpTag) != RESULT_OK )
    {
      DefaultLogSink().Error("No tag for entry %s\n", Entry.name);
      return RESULT_FAIL;
    }

  if ( ! MemIOWriter::WriteUi8(TmpTag.a) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
  if ( ! MemIOWriter::WriteUi8(TmpTag.b) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
  return RESULT_OK;
}